

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O0

void __thiscall pager::pager(pager *this,string *fileName)

{
  string *__file;
  allocator<char> local_39;
  string local_38 [32];
  string *local_18;
  string *fileName_local;
  pager *this_local;
  
  local_18 = fileName;
  fileName_local = &this->_fileName;
  std::__cxx11::string::string((string *)this,(string *)fileName);
  __file = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"r+",&local_39);
  r_file::open(&this->_f,(char *)__file,(int)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  map_page_from(&this->_mm,this,0);
  return;
}

Assistant:

pager::pager(const std::string& fileName) :
    _fileName(fileName),
    _f(r_file::open(fileName, "r+")),
    _mm(map_page_from(0))
{
}